

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

Bool Line_To(black_PWorker worker,Long x,Long y)

{
  Long *pLVar1;
  Bool BVar2;
  char cVar3;
  char cVar4;
  TStates TVar5;
  bool bVar6;
  ulong uVar7;
  long lVar8;
  
  TVar5 = worker->state;
  if (TVar5 == Descending_State) {
    lVar8 = worker->lastY;
    if (lVar8 < y) {
      BVar2 = End_Profile(worker,(long)worker->precision_half <=
                                 (long)((-(long)worker->precision & (lVar8 + worker->precision) - 1U
                                        ) - lVar8));
      if (BVar2 != '\0') {
        return '\x01';
      }
      bVar6 = (long)worker->precision_half <=
              (long)((-(long)worker->precision & (worker->lastY + (long)worker->precision) - 1U) -
                    worker->lastY);
      TVar5 = Ascending_State;
LAB_0023b958:
      cVar3 = New_Profile(worker,TVar5,bVar6);
LAB_0023b989:
      if (cVar3 != '\0') {
        return '\x01';
      }
LAB_0023b991:
      TVar5 = worker->state;
      goto LAB_0023b998;
    }
LAB_0023b9ca:
    cVar3 = worker->fresh;
    cVar4 = Line_Up(worker,worker->lastX,-lVar8,x,-y,-worker->maxY,-worker->minY);
    if ((cVar3 != '\0') && (worker->fresh == '\0')) {
      pLVar1 = &worker->cProfile->start;
      *pLVar1 = -*pLVar1;
    }
  }
  else {
    if (TVar5 == Ascending_State) {
      uVar7 = worker->lastY;
      if (y < (long)uVar7) {
        BVar2 = End_Profile(worker,(long)worker->precision_half <=
                                   (long)(uVar7 & (long)(worker->precision + -1)));
        if (BVar2 != '\0') {
          return '\x01';
        }
        bVar6 = (long)worker->precision_half <= ((long)(worker->precision + -1) & worker->lastY);
        TVar5 = Descending_State;
        goto LAB_0023b958;
      }
    }
    else {
      if (TVar5 == Unknown_State) {
        uVar7 = worker->lastY;
        if ((long)uVar7 < y) {
          bVar6 = (long)worker->precision_half <=
                  (long)((-(long)worker->precision & (uVar7 + (long)worker->precision) - 1) - uVar7)
          ;
          TVar5 = Ascending_State;
LAB_0023b981:
          cVar3 = New_Profile(worker,TVar5,bVar6);
          goto LAB_0023b989;
        }
        if (y < (long)uVar7) {
          bVar6 = (long)worker->precision_half <= (long)(uVar7 & (long)(worker->precision + -1));
          TVar5 = Descending_State;
          goto LAB_0023b981;
        }
        goto LAB_0023b991;
      }
LAB_0023b998:
      if (TVar5 == Descending_State) {
        lVar8 = worker->lastY;
        goto LAB_0023b9ca;
      }
      if (TVar5 != Ascending_State) goto LAB_0023ba15;
      uVar7 = worker->lastY;
    }
    cVar4 = Line_Up(worker,worker->lastX,uVar7,x,y,worker->minY,worker->maxY);
  }
  if (cVar4 != '\0') {
    return '\x01';
  }
LAB_0023ba15:
  worker->lastX = x;
  worker->lastY = y;
  return '\0';
}

Assistant:

static Bool
  Line_To( RAS_ARGS Long  x,
                    Long  y )
  {
    /* First, detect a change of direction */

    switch ( ras.state )
    {
    case Unknown_State:
      if ( y > ras.lastY )
      {
        if ( New_Profile( RAS_VARS Ascending_State,
                                   IS_BOTTOM_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      else
      {
        if ( y < ras.lastY )
          if ( New_Profile( RAS_VARS Descending_State,
                                     IS_TOP_OVERSHOOT( ras.lastY ) ) )
            return FAILURE;
      }
      break;

    case Ascending_State:
      if ( y < ras.lastY )
      {
        if ( End_Profile( RAS_VARS IS_TOP_OVERSHOOT( ras.lastY ) ) ||
             New_Profile( RAS_VARS Descending_State,
                                   IS_TOP_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      break;

    case Descending_State:
      if ( y > ras.lastY )
      {
        if ( End_Profile( RAS_VARS IS_BOTTOM_OVERSHOOT( ras.lastY ) ) ||
             New_Profile( RAS_VARS Ascending_State,
                                   IS_BOTTOM_OVERSHOOT( ras.lastY ) ) )
          return FAILURE;
      }
      break;

    default:
      ;
    }

    /* Then compute the lines */

    switch ( ras.state )
    {
    case Ascending_State:
      if ( Line_Up( RAS_VARS ras.lastX, ras.lastY,
                             x, y, ras.minY, ras.maxY ) )
        return FAILURE;
      break;

    case Descending_State:
      if ( Line_Down( RAS_VARS ras.lastX, ras.lastY,
                               x, y, ras.minY, ras.maxY ) )
        return FAILURE;
      break;

    default:
      ;
    }

    ras.lastX = x;
    ras.lastY = y;

    return SUCCESS;
  }